

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtextdocument.cpp
# Opt level: O2

void __thiscall QTextHtmlExporter::emitAlignment(QTextHtmlExporter *this,Alignment align)

{
  if ((((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i & 1) == 0) &&
     (((((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 2) != 0 ||
       (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
               super_QFlagsStorage<Qt::AlignmentFlag>.i & 4) != 0)) ||
      (((uint)align.super_QFlagsStorageHelper<Qt::AlignmentFlag,_4>.
              super_QFlagsStorage<Qt::AlignmentFlag>.i & 8) != 0)))) {
    QString::append((QLatin1String *)this);
    return;
  }
  return;
}

Assistant:

void QTextHtmlExporter::emitAlignment(Qt::Alignment align)
{
    if (align & Qt::AlignLeft)
        return;
    else if (align & Qt::AlignRight)
        html += " align=\"right\""_L1;
    else if (align & Qt::AlignHCenter)
        html += " align=\"center\""_L1;
    else if (align & Qt::AlignJustify)
        html += " align=\"justify\""_L1;
}